

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

void duckdb::QuantileListOperation<long,true>::
     Window<duckdb::QuantileState<long,duckdb::QuantileStandardType>,long,duckdb::list_entry_t>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *list,idx_t lidx
               )

{
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *this;
  ValidityMask *row_idx;
  WindowQuantileState<long> *this_00;
  SubFrames *in_RCX;
  CursorType *in_RDX;
  WindowQuantileState<long> *in_RSI;
  IncludedType *in_RDI;
  idx_t in_R8;
  QuantileIncluded<long> *in_R9;
  QuantileBindData *unaff_retaddr;
  WindowQuantileState<long> *window_state;
  ValidityMask *lmask;
  idx_t n;
  QuantileIncluded<long> included;
  QuantileBindData *bind_data;
  ValidityMask *fmask;
  CursorType *data;
  QuantileState<long,_duckdb::QuantileStandardType> *gstate;
  QuantileState<long,_duckdb::QuantileStandardType> *state;
  QuantileBindData *pQVar2;
  QuantileState<long,_duckdb::QuantileStandardType> *in_stack_ffffffffffffff80;
  WindowPartitionInput *in_stack_ffffffffffffff88;
  QuantileState<long,_duckdb::QuantileStandardType> *in_stack_ffffffffffffff90;
  QuantileIncluded<long> local_68;
  QuantileBindData *local_58;
  ValidityMask *local_50;
  CursorType *local_48;
  CursorType *local_40;
  SubFrames *frames_00;
  
  local_40 = in_RDX;
  frames_00 = in_RCX;
  local_48 = QuantileState<long,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
                       (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_50 = (ValidityMask *)
             (in_RSI->m).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  optional_ptr<duckdb::FunctionData,_true>::operator->
            ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffff80);
  local_58 = FunctionData::Cast<duckdb::QuantileBindData>((FunctionData *)in_stack_ffffffffffffff80)
  ;
  QuantileIncluded<long>::QuantileIncluded(&local_68,local_50,local_48);
  this = (TemplatedValidityMask<unsigned_long> *)QuantileOperation::FrameSize<long>(in_R9,in_RCX);
  if (this == (TemplatedValidityMask<unsigned_long> *)0x0) {
    row_idx = FlatVector::Validity((Vector *)0xa5e13a);
    TemplatedValidityMask<unsigned_long>::Set
              (this,(idx_t)row_idx,SUB81((ulong)in_stack_ffffffffffffff80 >> 0x38,0));
  }
  else if ((local_40 == (CursorType *)0x0) ||
          (bVar1 = QuantileState<long,_duckdb::QuantileStandardType>::HasTree
                             (in_stack_ffffffffffffff80), !bVar1)) {
    this_00 = QuantileState<long,_duckdb::QuantileStandardType>::GetOrCreateWindowState
                        (in_stack_ffffffffffffff80);
    WindowQuantileState<long>::UpdateSkip
              ((WindowQuantileState<long> *)lmask,(CursorType *)window_state,
               (SubFrames *)unaff_retaddr,in_RDI);
    pQVar2 = local_58;
    WindowQuantileState<long>::WindowList<long,true>
              (in_RSI,in_RDX,frames_00,in_R8,(Vector *)in_R9,(idx_t)in_RCX,unaff_retaddr);
    vector<duckdb::FrameBounds,_true>::operator=
              ((vector<duckdb::FrameBounds,_true> *)this_00,
               (vector<duckdb::FrameBounds,_true> *)pQVar2);
  }
  else {
    QuantileState<long,_duckdb::QuantileStandardType>::GetWindowState
              ((QuantileState<long,_duckdb::QuantileStandardType> *)0xa5e17a);
    WindowQuantileState<long>::WindowList<long,true>
              (in_RSI,in_RDX,frames_00,in_R8,(Vector *)in_R9,(idx_t)in_RCX,unaff_retaddr);
  }
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &list,
	                   idx_t lidx) {
		auto &state = *reinterpret_cast<STATE *>(l_state);
		auto gstate = reinterpret_cast<const STATE *>(g_state);

		auto &data = state.GetOrCreateWindowCursor(partition);
		const auto &fmask = partition.filter_mask;

		D_ASSERT(aggr_input_data.bind_data);
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();

		QuantileIncluded<INPUT_TYPE> included(fmask, data);
		const auto n = FrameSize(included, frames);

		// Result is a constant LIST<RESULT_TYPE> with a fixed length
		if (!n) {
			auto &lmask = FlatVector::Validity(list);
			lmask.Set(lidx, false);
			return;
		}

		if (gstate && gstate->HasTree()) {
			gstate->GetWindowState().template WindowList<CHILD_TYPE, DISCRETE>(data, frames, n, list, lidx, bind_data);
		} else {
			auto &window_state = state.GetOrCreateWindowState();
			window_state.UpdateSkip(data, frames, included);
			window_state.template WindowList<CHILD_TYPE, DISCRETE>(data, frames, n, list, lidx, bind_data);
			window_state.prevs = frames;
		}
	}